

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-list.c
# Opt level: O1

void monster_list_format_textblock
               (monster_list_t *list,textblock *tb,wchar_t max_lines,wchar_t max_width,
               size_t *max_height_result,size_t *max_width_result)

{
  short sVar1;
  ushort uVar2;
  uint16_t uVar3;
  wchar_t lines_to_display;
  wchar_t wVar4;
  uint uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  size_t max_esp_line;
  size_t max_los_line;
  textblock *local_38;
  
  max_los_line = 0;
  max_esp_line = 0;
  if ((list != (monster_list_t *)0x0) && (list->entries != (monster_list_entry_t *)0x0)) {
    sVar1 = player->timed[6];
    if (0 < sVar1) {
      if (max_height_result != (size_t *)0x0) {
        *max_height_result = 1;
      }
      if (max_width_result != (size_t *)0x0) {
        *max_width_result = 0x38;
      }
      if (tb != (textblock *)0x0) {
        local_38 = tb;
        textblock_append_c(tb,'\x03',"%s",
                           "Your hallucinations are too wild to see things clearly.\n");
        tb = local_38;
      }
      if (0 < sVar1) {
        return;
      }
    }
    wVar4 = (wchar_t)list->total_entries[0];
    uVar2 = list->total_entries[1];
    uVar5 = -(uint)(uVar2 == 0) | 0xfffffffd;
    wVar6 = (uint)(uVar2 != 0) * 2 + L'\x01';
    if (max_height_result != (size_t *)0x0) {
      *max_height_result = (ulong)(uint)(wVar6 + wVar4 + (uint)uVar2);
    }
    wVar7 = (max_lines - wVar4) + uVar5;
    wVar8 = L'\x01';
    if (L'\x01' < wVar7) {
      wVar8 = wVar7;
    }
    wVar8 = wVar8 + L'\xffffffff';
    if ((int)(uint)uVar2 <= wVar7) {
      wVar8 = (uint)uVar2;
    }
    lines_to_display = max_lines + L'\xffffffff' + uVar5;
    if (L'\xffffffff' < wVar7) {
      lines_to_display = wVar4;
    }
    if (max_lines <= wVar6) {
      wVar8 = L'\0';
      lines_to_display = L'\0';
    }
    monster_list_format_section
              (list,tb,MONSTER_LIST_SECTION_LOS,lines_to_display,max_width,"You can see",false,
               &max_los_line);
    if (list->total_entries[1] != 0) {
      uVar3 = list->total_monsters[0];
      if (tb != (textblock *)0x0) {
        textblock_append(tb,"\n");
      }
      monster_list_format_section
                (list,tb,MONSTER_LIST_SECTION_ESP,wVar8,max_width,"You are aware of",uVar3 != 0,
                 &max_esp_line);
    }
    if (max_width_result != (size_t *)0x0) {
      if (max_esp_line < max_los_line) {
        max_esp_line = max_los_line;
      }
      *max_width_result = max_esp_line;
    }
  }
  return;
}

Assistant:

static void monster_list_format_textblock(const monster_list_t *list, textblock *tb, int max_lines, int max_width, size_t *max_height_result, size_t *max_width_result)
{
	int header_lines = 1;
	int lines_remaining;
	int los_lines_to_display;
	int esp_lines_to_display;
	size_t max_los_line = 0;
	size_t max_esp_line = 0;

	if (list == NULL || list->entries == NULL)
		return;

	if (monster_list_format_special(list, tb, max_lines, max_width,
									max_height_result, max_width_result))
		return;

	los_lines_to_display = list->total_entries[MONSTER_LIST_SECTION_LOS];
	esp_lines_to_display = list->total_entries[MONSTER_LIST_SECTION_ESP];

	if (list->total_entries[MONSTER_LIST_SECTION_ESP] > 0)
		header_lines += 2;

	if (max_height_result != NULL)
		*max_height_result = header_lines + los_lines_to_display +
			esp_lines_to_display;

	lines_remaining = max_lines - header_lines -
		list->total_entries[MONSTER_LIST_SECTION_LOS];

	/* Remove ESP lines as needed. */
	if (lines_remaining < list->total_entries[MONSTER_LIST_SECTION_ESP])
		esp_lines_to_display = MAX(lines_remaining - 1, 0);

	/* If we don't even have enough room for the ESP header, start removing
	 * LOS lines, leaving one for the "...others". */
	if (lines_remaining < 0)
		los_lines_to_display = list->total_entries[MONSTER_LIST_SECTION_LOS] -
			abs(lines_remaining) - 1;

	/* Display only headers if we don't have enough space. */
	if (header_lines >= max_lines) {
		los_lines_to_display = 0;
		esp_lines_to_display = 0;
	}

	monster_list_format_section(list, tb, MONSTER_LIST_SECTION_LOS,
								los_lines_to_display, max_width,
								"You can see", false, &max_los_line);

	if (list->total_entries[MONSTER_LIST_SECTION_ESP] > 0) {
		bool show_others = list->total_monsters[MONSTER_LIST_SECTION_LOS] > 0;

		if (tb != NULL)
			textblock_append(tb, "\n");

		monster_list_format_section(list, tb, MONSTER_LIST_SECTION_ESP,
									esp_lines_to_display, max_width,
									"You are aware of", show_others,
									&max_esp_line);
	}

	if (max_width_result != NULL)
		*max_width_result = MAX(max_los_line, max_esp_line);
}